

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O2

void __thiscall n_e_s::nes::Nes::load_rom(Nes *this,istream *bytestream)

{
  IRom *pIVar1;
  pointer puVar2;
  MemBankList cpu_membanks;
  MemBankList ppu_membanks;
  MemBankList local_88;
  MemBankList local_68;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_48;
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  local_28;
  
  core::RomFactory::from_bytes((RomFactory *)&local_68,bytestream);
  puVar2 = local_68.
           super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pIVar1 = (this->rom_)._M_t.
           super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
           super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl;
  (this->rom_)._M_t.
  super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
  super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl = (IRom *)puVar2;
  if (pIVar1 != (IRom *)0x0) {
    (*pIVar1->_vptr_IRom[1])();
    if (local_68.
        super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((local_68.
                  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
                ._M_t.
                super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
                .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl[1].
                _vptr_IMemBank)();
    }
  }
  core::MemBankFactory::create_nes_ppu_mem_banks
            (&local_68,
             (this->rom_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
             super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl);
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*((this->ppu_mmu_)._M_t.
     super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
     super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl)->_vptr_IMmu[2])();
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_28);
  core::MemBankFactory::create_nes_mem_banks
            (&local_88,
             (this->ppu_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
             super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl,
             (this->rom_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_>._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IRom_*,_std::default_delete<n_e_s::core::IRom>_>.
             super__Head_base<0UL,_n_e_s::core::IRom_*,_false>._M_head_impl,
             (this->controller1_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::INesController_*,_std::default_delete<n_e_s::core::INesController>_>
             .super__Head_base<0UL,_n_e_s::core::INesController_*,_false>._M_head_impl,
             (this->controller2_)._M_t.
             super___uniq_ptr_impl<n_e_s::core::INesController,_std::default_delete<n_e_s::core::INesController>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::INesController_*,_std::default_delete<n_e_s::core::INesController>_>
             .super__Head_base<0UL,_n_e_s::core::INesController_*,_false>._M_head_impl);
  local_48.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_88.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_88.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_88.
       super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*((this->mmu_)._M_t.
     super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
     super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl)->_vptr_IMmu[2])();
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_48);
  (*(((this->cpu_)._M_t.
      super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>._M_t
      .super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>.
      super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu[3]
  )();
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void Nes::load_rom(std::istream &bytestream) {
    rom_ = RomFactory::from_bytes(bytestream);

    MemBankList ppu_membanks{
            MemBankFactory::create_nes_ppu_mem_banks(rom_.get())};
    ppu_mmu_->set_mem_banks(std::move(ppu_membanks));

    MemBankList cpu_membanks{MemBankFactory::create_nes_mem_banks(
            ppu_.get(), rom_.get(), controller1_.get(), controller2_.get())};
    mmu_->set_mem_banks(std::move(cpu_membanks));

    reset();
}